

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void redit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  int value;
  int cmd;
  char command [4608];
  char arg [4608];
  AREA_DATA_conflict *pArea;
  ROOM_INDEX_DATA *pRoom;
  char *in_stack_000036d8;
  CHAR_DATA *in_stack_000036e0;
  char *in_stack_00004900;
  CHAR_DATA *in_stack_00004908;
  char *in_stack_ffffffffffffdb98;
  char *in_stack_ffffffffffffdba0;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  char *in_stack_ffffffffffffdbc0;
  char *in_stack_ffffffffffffdbc8;
  ulong uVar5;
  int local_242c;
  char local_2428 [4552];
  char *in_stack_ffffffffffffeda0;
  flag_type *in_stack_ffffffffffffeda8;
  char local_1228 [4616];
  CHAR_DATA *local_20;
  CHAR_DATA *local_18;
  char *local_10;
  CHAR_DATA *local_8;
  
  local_18 = (CHAR_DATA *)in_RDI->in_room;
  local_20 = local_18->pet;
  local_10 = in_RSI;
  local_8 = in_RDI;
  smash_tilde(in_RSI);
  strcpy(local_1228,local_10);
  local_10 = one_argument(in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
  bVar1 = is_switched(local_8);
  if ((bVar1) ||
     ((((*(int *)((long)&local_20->gold + 4) < local_8->pcdata->security ||
        (pcVar3 = strstr(*(char **)&local_20->max_mana,local_8->name), pcVar3 == (char *)0x0)) &&
       (local_8->pcdata->security <= *(int *)((long)&local_20->gold + 4))) &&
      (pcVar3 = strstr(*(char **)&local_20->max_mana,"All"), pcVar3 == (char *)0x0)))) {
    send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    edit_done((CHAR_DATA *)0x76d8e8);
  }
  else {
    bVar1 = str_cmp(local_2428,"done");
    if ((bVar1) && (bVar1 = str_cmp(local_2428,"quit"), bVar1)) {
      bVar1 = is_switched(local_8);
      if ((bVar1) ||
         (((*(int *)((long)&local_20->gold + 4) < local_8->pcdata->security ||
           (pcVar3 = strstr(*(char **)&local_20->max_mana,local_8->name), pcVar3 == (char *)0x0)) &&
          ((local_8->pcdata->security <= *(int *)((long)&local_20->gold + 4) &&
           (pcVar3 = strstr(*(char **)&local_20->max_mana,"All"), pcVar3 == (char *)0x0)))))) {
        interpret(in_stack_00004908,in_stack_00004900);
      }
      else {
        bVar1 = str_cmp(local_2428,"");
        if (bVar1) {
          iVar2 = flag_value(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
          if (iVar2 == -99) {
            iVar2 = flag_value(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
            if (iVar2 == -99) {
              bVar1 = str_prefix(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0);
              if (!bVar1) {
                sprintf(local_2428,"north");
              }
              bVar1 = str_prefix(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0);
              if (!bVar1) {
                sprintf(local_2428,"south");
              }
              bVar1 = str_prefix(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0);
              if (!bVar1) {
                sprintf(local_2428,"east");
              }
              bVar1 = str_prefix(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0);
              if (!bVar1) {
                sprintf(local_2428,"west");
              }
              bVar1 = str_prefix(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0);
              if (!bVar1) {
                sprintf(local_2428,"up");
              }
              bVar1 = str_prefix(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0);
              if (!bVar1) {
                sprintf(local_2428,"down");
              }
              local_242c = 0;
              while (redit_table[local_242c].name != (char *)0x0) {
                bVar1 = str_prefix(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0);
                if (!bVar1) {
                  bVar1 = (*redit_table[local_242c].olc_fun)(local_8,local_10);
                  if (!bVar1) {
                    return;
                  }
                  _Var4 = std::pow<int,int>(0,0x76dd92);
                  local_20->defending = (CHAR_DATA *)((long)_Var4 | (ulong)local_20->defending);
                  return;
                }
                local_242c = local_242c + 1;
              }
              interpret(in_stack_00004908,in_stack_00004900);
            }
            else {
              local_18->timer = (short)iVar2;
              _Var4 = std::pow<int,int>(0,0x76dbed);
              local_20->defending = (CHAR_DATA *)((long)_Var4 | (ulong)local_20->defending);
              send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
            }
          }
          else {
            uVar5 = local_18->act[(long)(iVar2 / 0x20) + -8];
            _Var4 = std::pow<int,int>(0,0x76da82);
            if ((uVar5 & (long)_Var4) == 0) {
              _Var4 = std::pow<int,int>(0,0x76db1e);
              local_18->act[(long)(iVar2 / 0x20) + -8] =
                   (long)_Var4 | local_18->act[(long)(iVar2 / 0x20) + -8];
              in_stack_ffffffffffffdba8 = local_18;
            }
            else {
              _Var4 = std::pow<int,int>(0,0x76daad);
              in_stack_ffffffffffffdbb0 = (char *)((long)_Var4 ^ 0xffffffffffffffff);
              local_18->act[(long)(iVar2 / 0x20) + -8] =
                   (ulong)in_stack_ffffffffffffdbb0 & local_18->act[(long)(iVar2 / 0x20) + -8];
            }
            _Var4 = std::pow<int,int>(0,0x76db80);
            local_20->defending = (CHAR_DATA *)((long)_Var4 | (ulong)local_20->defending);
            send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
          }
        }
        else {
          redit_show(in_stack_000036e0,in_stack_000036d8);
        }
      }
    }
    else {
      edit_done((CHAR_DATA *)0x76d926);
    }
  }
  return;
}

Assistant:

void redit(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	AREA_DATA *pArea;
	char arg[MAX_STRING_LENGTH];
	char command[MAX_INPUT_LENGTH];
	int cmd;
	int value;

	EDIT_ROOM(ch, pRoom);
	pArea = pRoom->area;

	smash_tilde(argument);
	strcpy(arg, argument);
	argument = one_argument(argument, command);

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("REdit:  Insufficient security to modify room.\n\r", ch);
		edit_done(ch);
		return;
	}

	if (!str_cmp(command, "done") || !str_cmp(command, "quit"))
	{
		edit_done(ch);
		return;
	}

	if (!IS_BUILDER(ch, pArea))
		return interpret(ch, arg);

	if (!str_cmp(command, ""))
	{
		redit_show(ch, "");
		return;
	}

	if ((value = flag_value(room_flags, command)) != NO_FLAG)
	{
		TOGGLE_BIT(pRoom->room_flags, value);

		SET_BIT(pArea->area_flags, AREA_CHANGED);
		send_to_char("Room flag toggled.\n\r", ch);
		return;
	}

	if ((value = flag_value(sector_flags, command)) != NO_FLAG)
	{
		pRoom->sector_type = value;

		SET_BIT(pArea->area_flags, AREA_CHANGED);
		send_to_char("Sector type set.\n\r", ch);
		return;
	}

	/* Check for moment */
	if (!str_prefix(command, "north"))
		sprintf(command, "north");

	if (!str_prefix(command, "south"))
		sprintf(command, "south");

	if (!str_prefix(command, "east"))
		sprintf(command, "east");

	if (!str_prefix(command, "west"))
		sprintf(command, "west");

	if (!str_prefix(command, "up"))
		sprintf(command, "up");

	if (!str_prefix(command, "down"))
		sprintf(command, "down");

	/* Search Table and Dispatch Command. */
	for (cmd = 0; redit_table[cmd].name != nullptr; cmd++)
	{
		if (!str_prefix(command, redit_table[cmd].name))
		{
			if ((*redit_table[cmd].olc_fun)(ch, argument))
				SET_BIT(pArea->area_flags, AREA_CHANGED);

			return;
		}
	}

	/* Default to Standard Interpreter. */
	interpret(ch, arg);
}